

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixed_size_uncompressed.cpp
# Opt level: O3

void __thiscall
duckdb::UncompressedCompressState::CreateEmptySegment
          (UncompressedCompressState *this,idx_t row_start)

{
  CompressionFunction *function;
  PartialBlockManager *this_00;
  _func_int **pp_Var1;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> __p;
  __uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> _Var2;
  atomic<duckdb::ColumnSegment_*> aVar3;
  DatabaseInstance *db;
  LogicalType *type;
  idx_t iVar4;
  idx_t iVar5;
  pointer pCVar6;
  ColumnCheckpointState *pCVar7;
  BlockManager *pBVar8;
  WriteOverflowStringsToDisk *this_01;
  _Head_base<0UL,_duckdb::ColumnSegment_*,_false> local_48;
  __atomic_base<unsigned_long> local_40;
  atomic<duckdb::ColumnSegment_*> local_38;
  
  local_40._M_i = row_start;
  db = ColumnDataCheckpointData::GetDatabase(this->checkpoint_data);
  type = ColumnDataCheckpointData::GetType(this->checkpoint_data);
  pBVar8 = (this->super_CompressionState).info.block_manager;
  function = this->function;
  iVar4 = optional_idx::GetIndex(&pBVar8->block_alloc_size);
  iVar5 = optional_idx::GetIndex(&pBVar8->block_header_size);
  ColumnSegment::CreateTransientSegment
            ((ColumnSegment *)&stack0xffffffffffffffb8,db,function,type,local_40._M_i,iVar4 - iVar5,
             (this->super_CompressionState).info.block_manager);
  if (type->physical_type_ == VARCHAR) {
    pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                         *)&stack0xffffffffffffffb8);
    local_38._M_b._M_p =
         (__base_type)
         (pCVar6->segment_state).
         super_unique_ptr<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::CompressedSegmentState,_std::default_delete<duckdb::CompressedSegmentState>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::CompressedSegmentState_*,_std::default_delete<duckdb::CompressedSegmentState>_>
         .super__Head_base<0UL,_duckdb::CompressedSegmentState_*,_false>._M_head_impl;
    optional_ptr<duckdb::CompressedSegmentState,_true>::CheckValid
              ((optional_ptr<duckdb::CompressedSegmentState,_true> *)&stack0xffffffffffffffc8);
    aVar3._M_b._M_p = local_38._M_b._M_p;
    pCVar7 = ColumnDataCheckpointData::GetCheckpointState(this->checkpoint_data);
    this_00 = pCVar7->partial_block_manager;
    pBVar8 = PartialBlockManager::GetBlockManager(this_00);
    *(BlockManager **)&(((SegmentStatistics *)((long)aVar3._M_b._M_p + 0x50))->statistics).type =
         pBVar8;
    this_01 = (WriteOverflowStringsToDisk *)operator_new(0x38);
    WriteOverflowStringsToDisk::WriteOverflowStringsToDisk(this_01,this_00);
    pp_Var1 = *(_func_int ***)((long)aVar3._M_b._M_p + 0x48);
    *(WriteOverflowStringsToDisk **)((long)aVar3._M_b._M_p + 0x48) = this_01;
    if (pp_Var1 != (_func_int **)0x0) {
      (**(code **)(*pp_Var1 + 8))();
    }
  }
  __p._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (ColumnSegment *)0x0;
  ::std::__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_>::reset
            ((__uniq_ptr_impl<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>_> *)
             &this->current_segment,__p._M_head_impl);
  pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(&this->current_segment);
  ColumnSegment::InitializeAppend(pCVar6,&this->append_state);
  _Var2._M_t.
  super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>.
  super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl =
       (tuple<duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>)
       (tuple<duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>)
       local_48._M_head_impl;
  if ((_Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>)
      local_48._M_head_impl != (ColumnSegment *)0x0) {
    ColumnSegment::~ColumnSegment(local_48._M_head_impl);
    operator_delete((void *)_Var2._M_t.
                            super__Tuple_impl<0UL,_duckdb::ColumnSegment_*,_std::default_delete<duckdb::ColumnSegment>_>
                            .super__Head_base<0UL,_duckdb::ColumnSegment_*,_false>._M_head_impl);
  }
  return;
}

Assistant:

void UncompressedCompressState::CreateEmptySegment(idx_t row_start) {
	auto &db = checkpoint_data.GetDatabase();
	auto &type = checkpoint_data.GetType();

	auto compressed_segment = ColumnSegment::CreateTransientSegment(db, function, type, row_start, info.GetBlockSize(),
	                                                                info.GetBlockManager());
	if (type.InternalType() == PhysicalType::VARCHAR) {
		auto &state = compressed_segment->GetSegmentState()->Cast<UncompressedStringSegmentState>();
		auto &partial_block_manager = checkpoint_data.GetCheckpointState().GetPartialBlockManager();
		state.block_manager = partial_block_manager.GetBlockManager();
		state.overflow_writer = make_uniq<WriteOverflowStringsToDisk>(partial_block_manager);
	}
	current_segment = std::move(compressed_segment);
	current_segment->InitializeAppend(append_state);
}